

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadContext.cpp
# Opt level: O3

uint __thiscall ThreadContext::ReleaseSourceDynamicProfileManagers(ThreadContext *this,WCHAR *url)

{
  BaseDictionary<const_char16_t_*,_ThreadContext::SourceDynamicProfileManagerCache_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *pBVar1;
  int *piVar2;
  SimpleDictionaryEntry<Memory::WriteBarrierPtr<const_char16_t>,_Memory::WriteBarrierPtr<ThreadContext::SourceDynamicProfileManagerCache>_>
  *pSVar3;
  SourceDynamicProfileManagerCache *this_00;
  uint uVar4;
  int iVar5;
  RecyclableData *pRVar6;
  WCHAR *pWVar7;
  WCHAR WVar8;
  uint uVar9;
  uint uVar10;
  hash_t hashCode;
  WCHAR *local_40;
  WCHAR *url_local;
  
  if ((this->recyclableData).ptr != (RecyclableData *)0x0) {
    url_local = (WCHAR *)&this->recyclableData;
    local_40 = url;
    pRVar6 = Memory::RecyclerRootPtr<ThreadContext::RecyclableData>::operator->
                       ((RecyclerRootPtr<ThreadContext::RecyclableData> *)url_local);
    pBVar1 = (pRVar6->sourceProfileManagersByUrl).ptr;
    piVar2 = (pBVar1->buckets).ptr;
    uVar4 = 0;
    if (piVar2 != (int *)0x0) {
      WVar8 = *url;
      if (WVar8 == L'\0') {
        hashCode = 0x2393b8b;
      }
      else {
        pWVar7 = url + 1;
        uVar9 = 0x811c9dc5;
        do {
          uVar10 = (ushort)WVar8 ^ uVar9;
          uVar9 = uVar10 * 0x1000193;
          WVar8 = *pWVar7;
          pWVar7 = pWVar7 + 1;
        } while (WVar8 != L'\0');
        hashCode = uVar10 * 0x2000326 + 1;
      }
      uVar4 = JsUtil::
              BaseDictionary<const_char16_t_*,_ThreadContext::SourceDynamicProfileManagerCache_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
              ::GetBucket(hashCode,pBVar1->bucketCount,pBVar1->modFunctionIndex);
      uVar9 = piVar2[uVar4];
      uVar4 = 0;
      if (-1 < (int)uVar9) {
        pSVar3 = (pBVar1->entries).ptr;
        uVar4 = 0;
        do {
          iVar5 = PAL_wcscmp(pSVar3[uVar9].
                             super_DefaultHashedEntry<Memory::WriteBarrierPtr<const_char16_t>,_Memory::WriteBarrierPtr<ThreadContext::SourceDynamicProfileManagerCache>,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                             .
                             super_KeyValueEntry<Memory::WriteBarrierPtr<const_char16_t>,_Memory::WriteBarrierPtr<ThreadContext::SourceDynamicProfileManagerCache>_>
                             .
                             super_ValueEntry<Memory::WriteBarrierPtr<ThreadContext::SourceDynamicProfileManagerCache>,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<Memory::WriteBarrierPtr<const_char16_t>,_Memory::WriteBarrierPtr<ThreadContext::SourceDynamicProfileManagerCache>_>_>
                             .
                             super_KeyValueEntryDataLayout2<Memory::WriteBarrierPtr<const_char16_t>,_Memory::WriteBarrierPtr<ThreadContext::SourceDynamicProfileManagerCache>_>
                             .key.ptr,url);
          if (iVar5 == 0) {
            if (pBVar1->stats != (DictionaryStats *)0x0) {
              DictionaryStats::Lookup(pBVar1->stats,uVar4);
            }
            this_00 = (pBVar1->entries).ptr[uVar9].
                      super_DefaultHashedEntry<Memory::WriteBarrierPtr<const_char16_t>,_Memory::WriteBarrierPtr<ThreadContext::SourceDynamicProfileManagerCache>,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                      .
                      super_KeyValueEntry<Memory::WriteBarrierPtr<const_char16_t>,_Memory::WriteBarrierPtr<ThreadContext::SourceDynamicProfileManagerCache>_>
                      .
                      super_ValueEntry<Memory::WriteBarrierPtr<ThreadContext::SourceDynamicProfileManagerCache>,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<Memory::WriteBarrierPtr<const_char16_t>,_Memory::WriteBarrierPtr<ThreadContext::SourceDynamicProfileManagerCache>_>_>
                      .
                      super_KeyValueEntryDataLayout2<Memory::WriteBarrierPtr<const_char16_t>,_Memory::WriteBarrierPtr<ThreadContext::SourceDynamicProfileManagerCache>_>
                      .value.ptr;
            if (this_00 == (SourceDynamicProfileManagerCache *)0x0) {
              return 0;
            }
            uVar4 = SourceDynamicProfileManagerCache::Release(this_00);
            if (DAT_015bc46a == '\x01') {
              Output::Trace(DynamicProfilePhase,
                            L"Release dynamic source profile manger %d Url: %s\n",(ulong)uVar4,url);
            }
            Output::Flush();
            if (uVar4 == 0) {
              pRVar6 = Memory::RecyclerRootPtr<ThreadContext::RecyclableData>::operator->
                                 ((RecyclerRootPtr<ThreadContext::RecyclableData> *)url_local);
              JsUtil::
              BaseDictionary<const_char16_t_*,_ThreadContext::SourceDynamicProfileManagerCache_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
              ::Remove((pRVar6->sourceProfileManagersByUrl).ptr,&local_40);
              return 0;
            }
            return uVar4;
          }
          uVar4 = uVar4 + 1;
          uVar9 = pSVar3[uVar9].
                  super_DefaultHashedEntry<Memory::WriteBarrierPtr<const_char16_t>,_Memory::WriteBarrierPtr<ThreadContext::SourceDynamicProfileManagerCache>,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                  .
                  super_KeyValueEntry<Memory::WriteBarrierPtr<const_char16_t>,_Memory::WriteBarrierPtr<ThreadContext::SourceDynamicProfileManagerCache>_>
                  .
                  super_ValueEntry<Memory::WriteBarrierPtr<ThreadContext::SourceDynamicProfileManagerCache>,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<Memory::WriteBarrierPtr<const_char16_t>,_Memory::WriteBarrierPtr<ThreadContext::SourceDynamicProfileManagerCache>_>_>
                  .
                  super_KeyValueEntryDataLayout2<Memory::WriteBarrierPtr<const_char16_t>,_Memory::WriteBarrierPtr<ThreadContext::SourceDynamicProfileManagerCache>_>
                  .next;
        } while (-1 < (int)uVar9);
      }
    }
    if (pBVar1->stats != (DictionaryStats *)0x0) {
      DictionaryStats::Lookup(pBVar1->stats,uVar4);
    }
  }
  return 0;
}

Assistant:

uint ThreadContext::ReleaseSourceDynamicProfileManagers(const WCHAR* url)
{
    // If we've already freed the recyclable data, we're shutting down the thread context so skip clean up
    if (this->recyclableData == nullptr) return 0;

    SourceDynamicProfileManagerCache* managerCache = this->recyclableData->sourceProfileManagersByUrl->Lookup(url, nullptr);
    uint refCount = 0;
    if(managerCache)  // manager cache may be null we exceeded -INMEMORY_CACHE_MAX_URL
    {
        refCount = managerCache->Release();
        OUTPUT_VERBOSE_TRACE(Js::DynamicProfilePhase, _u("Release dynamic source profile manger %d Url: %s\n"), refCount, url);
        Output::Flush();
        if(refCount == 0)
        {
            this->recyclableData->sourceProfileManagersByUrl->Remove(url);
        }
    }
    return refCount;
}